

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

QuantaResult * __thiscall
NEST::NESTcalc::GetQuanta
          (QuantaResult *__return_storage_ptr__,NESTcalc *this,YieldResult *yields,double density,
          vector<double,_std::allocator<double>_> *NRERWidthsParam,double SkewnessER)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  RandomGen *pRVar4;
  int64_t iVar5;
  runtime_error *this_00;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double dVar12;
  double dVar13;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Wvalue WVar20;
  
  __return_storage_ptr__->recombProb = 0.0;
  __return_storage_ptr__->Variance = 0.0;
  __return_storage_ptr__->photons = 0;
  __return_storage_ptr__->electrons = 0;
  __return_storage_ptr__->ions = 0;
  __return_storage_ptr__->excitons = 0;
  if ((ulong)((long)(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 0x58) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"ERROR: You need a minimum of 11 free parameters for the resolution model.");
LAB_00106e4f:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar13 = yields->ExcitonRatio;
  dVar11 = yields->PhotonYield + yields->ElectronYield;
  dVar10 = yields->ElectronYield / dVar11;
  dVar18 = 1.0;
  if (dVar10 <= 1.0) {
    dVar18 = dVar10;
  }
  if (dVar18 <= 0.0) {
    dVar18 = 0.0;
  }
  dVar10 = 0.0;
  if (0.0 <= dVar13) {
    dVar10 = dVar13;
  }
  dVar19 = 1.0 / (dVar10 + 1.0);
  dVar12 = 1.0 - (dVar10 + 1.0) * dVar18;
  bVar2 = ValidityTests::nearlyEqual(yields->Lindhard,1.0,1e-09);
  if (bVar2) {
    bVar2 = ValidityTests::nearlyEqual(dVar11,0.0,1e-09);
    iVar7 = 0;
    if (!bVar2) {
      (*this->_vptr_NESTcalc[0xf])
                (density,dVar11,SUB84(yields->ElectricField,0),this,NRERWidthsParam);
      pRVar4 = RandomGen::rndm();
      dVar10 = extraout_XMM0_Qa * dVar11;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar11 = RandomGen::rand_gauss(pRVar4,dVar11,dVar10,true);
      dVar11 = floor(dVar11 + 0.5);
      iVar7 = (int)dVar11;
    }
    pRVar4 = RandomGen::rndm();
    iVar5 = RandomGen::binom_draw(pRVar4,(long)iVar7,dVar19);
    iVar3 = (int)iVar5;
    iVar8 = iVar7 - iVar3;
  }
  else {
    dVar14 = (double)(~-(ulong)(dVar12 < 0.0) & (ulong)dVar10 |
                     (ulong)(1.0 / dVar18 + -1.0) & -(ulong)(dVar12 < 0.0));
    dVar10 = *(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pRVar4 = RandomGen::rndm();
    dVar10 = dVar10 * dVar11 * dVar19;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = RandomGen::rand_gauss(pRVar4,dVar11 * dVar19,dVar10,true);
    dVar10 = floor(dVar10 + 0.5);
    iVar3 = (int)dVar10;
    dVar10 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[1];
    pRVar4 = RandomGen::rndm();
    dVar10 = dVar10 * dVar11 * dVar14 * dVar19;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar11 = RandomGen::rand_gauss(pRVar4,dVar11 * dVar14 * dVar19,dVar10,true);
    dVar11 = floor(dVar11 + 0.5);
    iVar8 = (int)dVar11;
    iVar7 = iVar8 + iVar3;
  }
  if (iVar7 == 0) {
    __return_storage_ptr__->recombProb = 0.0;
    __return_storage_ptr__->Variance = 0.0;
    __return_storage_ptr__->photons = 0;
    __return_storage_ptr__->electrons = 0;
    __return_storage_ptr__->ions = 0;
    __return_storage_ptr__->excitons = 0;
  }
  else {
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    iVar9 = 0;
    if (0 < iVar3) {
      iVar9 = iVar3;
    }
    if (iVar7 <= iVar8) {
      iVar8 = iVar7;
    }
    if (iVar7 <= iVar9) {
      iVar9 = iVar7;
    }
    __return_storage_ptr__->ions = iVar9;
    __return_storage_ptr__->excitons = iVar8;
    dVar11 = (double)iVar9;
    if (iVar8 < 1) {
      dVar12 = (double)(-(ulong)(0.0 <= dVar13) & (ulong)dVar12 |
                       ~-(ulong)(0.0 <= dVar13) & (ulong)(yields->PhotonYield / dVar11));
    }
    if (iVar9 != 0) {
      dVar13 = 1.0;
      if (dVar12 <= 1.0) {
        dVar13 = dVar12;
      }
      if (dVar13 <= 0.0) {
        dVar13 = 0.0;
      }
      bVar2 = ValidityTests::nearlyEqual(dVar13,0.0,1e-09);
      if (!bVar2) {
        if (1.0 < yields->Lindhard || yields->Lindhard == 1.0) {
          (*this->_vptr_NESTcalc[0xe])(yields->ElectricField,this,NRERWidthsParam);
          dVar18 = extraout_XMM0_Qa_01;
        }
        else {
          (*this->_vptr_NESTcalc[0xd])(dVar18,this,NRERWidthsParam);
          dVar18 = extraout_XMM0_Qa_00;
        }
        bVar2 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
        dVar10 = 0.0;
        dVar12 = 0.0;
        if (!bVar2) {
          dVar12 = dVar18;
        }
        dVar18 = 1.0 - dVar13;
        if (((yields->PhotonYield + yields->ElectronYield <= 10000.0) &&
            (yields->ElectricField <= 4000.0)) && (50.0 <= yields->ElectricField)) {
          WVar20 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
          dVar19 = yields->PhotonYield;
          dVar14 = yields->ElectronYield;
          dVar17 = yields->ElectricField;
          bVar2 = ValidityTests::nearlyEqual(yields->Lindhard,1.0,1e-09);
          if (bVar2) {
            dVar10 = SkewnessER;
            if ((SkewnessER == -999.0) && (!NAN(SkewnessER))) {
              dVar10 = WVar20.Wq_eV * 0.001 * (dVar19 + dVar14);
              dVar19 = exp((dVar10 + -26.7) / 6.4);
              dVar14 = exp(dVar17 / -225.0);
              dVar15 = exp(dVar10 / -7.7);
              dVar16 = exp((dVar10 + -26.7) / -6.4);
              dVar10 = exp(dVar10 / -54.0);
              if (dVar17 < 0.0) {
                dVar17 = sqrt(dVar17);
              }
              else {
                dVar17 = SQRT(dVar17);
              }
              dVar17 = exp(dVar17 / -8.426149773176359);
              dVar10 = (1.0 / (dVar19 + 1.0)) * ((1.0 - dVar15) * dVar14 * 4.0 + 1.39) +
                       dVar17 * dVar10 * (1.0 / (dVar16 + 1.0)) * 22.1;
            }
          }
          else {
            dVar10 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[5];
          }
        }
        dVar14 = dVar13 * dVar18 * dVar11 + dVar12 * dVar12 * dVar11 * dVar11;
        dVar12 = dVar10 * dVar10 + 1.0;
        dVar19 = (dVar10 * -0.6366197723675814 * dVar10) / dVar12 + 1.0;
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
        }
        else {
          dVar19 = SQRT(dVar19);
        }
        if (dVar14 < 0.0) {
          dVar17 = sqrt(dVar14);
        }
        else {
          dVar17 = SQRT(dVar14);
        }
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        if ((ABS(dVar10) <= 2.2250738585072014e-308) ||
           (bVar2 = ValidityTests::nearlyEqual(54.0,54.0,1e-09), !bVar2)) {
          pRVar4 = RandomGen::rndm();
          if (dVar14 < 0.0) {
            dVar10 = sqrt(dVar14);
          }
          else {
            dVar10 = SQRT(dVar14);
          }
          dVar11 = RandomGen::rand_gauss(pRVar4,dVar18 * dVar11,dVar10,true);
        }
        else {
          dVar12 = (dVar10 / dVar12) * (dVar17 / dVar19);
          pRVar4 = RandomGen::rndm();
          if (dVar14 < 0.0) {
            dVar17 = sqrt(dVar14);
          }
          else {
            dVar17 = SQRT(dVar14);
          }
          dVar11 = RandomGen::rand_skewGauss
                             (pRVar4,dVar18 * dVar11 + (dVar12 + dVar12) * -0.39894228040143265,
                              dVar17 / dVar19,dVar10);
        }
        dVar11 = floor(dVar11 + 0.5);
        iVar3 = (int)dVar11;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        if (iVar9 <= iVar3) {
          iVar3 = iVar9;
        }
        iVar6 = 0;
        if (-1 < iVar7) {
          iVar6 = iVar3;
        }
        iVar1 = iVar7 - iVar6;
        if (iVar7 - iVar6 <= iVar8) {
          iVar1 = iVar8;
        }
        if (iVar3 + iVar1 == iVar8 + iVar9) {
          __return_storage_ptr__->Variance = dVar14;
          __return_storage_ptr__->recombProb = dVar13;
          __return_storage_ptr__->photons = iVar1;
          __return_storage_ptr__->electrons = iVar3;
          return __return_storage_ptr__;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"ERROR: Quanta not conserved. Tell Matthew Immediately!");
        goto LAB_00106e4f;
      }
    }
    __return_storage_ptr__->photons = iVar8;
    __return_storage_ptr__->electrons = iVar9;
    __return_storage_ptr__->recombProb = 0.0;
    __return_storage_ptr__->Variance = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

QuantaResult NESTcalc::GetQuanta(const YieldResult &yields, double density,
                                 const std::vector<double> &NRERWidthsParam,
                                 double SkewnessER) {
  QuantaResult result{};
  bool HighE;
  int Nq_actual, Ne, Nph, Ni, Nex;

  if (NRERWidthsParam.size() < 11) {
    throw std::runtime_error(
        "ERROR: You need a minimum of 11 free parameters for the resolution "
        "model.");
  }

  double excitonRatio = yields.ExcitonRatio;
  double Nq_mean = yields.PhotonYield + yields.ElectronYield;

  double elecFrac = max(0., min(yields.ElectronYield / Nq_mean, 1.));

  if (excitonRatio < 0.) {
    excitonRatio = 0.;
    HighE = true;
  } else {
    HighE = false;
  }

  double alf = 1. / (1. + excitonRatio);
  double recombProb = 1. - (excitonRatio + 1.) * elecFrac;
  if (recombProb < 0.) {
    excitonRatio = 1. / elecFrac - 1.;
  }

  if (ValidityTests::nearlyEqual(yields.Lindhard, 1.)) {
    if (ValidityTests::nearlyEqual(Nq_mean, 0.))
      Nq_actual = 0;
    else {
      double Fano =
          FanoER(density, Nq_mean, yields.ElectricField, NRERWidthsParam);
      Nq_actual = int(floor(
          RandomGen::rndm()->rand_gauss(Nq_mean, sqrt(Fano * Nq_mean), true) +
          0.5));
    }

    Ni = RandomGen::rndm()->binom_draw(Nq_actual, alf);
    Nex = Nq_actual - Ni;

  } else {
    double Fano = NRERWidthsParam[0];
    Ni = int(floor(RandomGen::rndm()->rand_gauss(
                       Nq_mean * alf, sqrt(Fano * Nq_mean * alf), true) +
                   0.5));
    Fano = NRERWidthsParam[1];
    Nex = int(floor(RandomGen::rndm()->rand_gauss(
                        Nq_mean * excitonRatio * alf,
                        sqrt(Fano * Nq_mean * excitonRatio * alf), true) +
                    0.5));
    Nq_actual = Nex + Ni;
  }

  if (Nq_actual == 0) {
    result.ions = 0;
    result.excitons = 0;
    result.photons = 0;
    result.electrons = 0;
    result.Variance = 0;
    result.recombProb = 0;
    return result;
  }

  if (Nex < 0) Nex = 0;
  if (Ni < 0) Ni = 0;
  if (Nex > Nq_actual) Nex = Nq_actual;
  if (Ni > Nq_actual) Ni = Nq_actual;

  result.ions = Ni;
  result.excitons = Nex;

  if (Nex <= 0 && HighE) recombProb = yields.PhotonYield / double(Ni);
  recombProb = max(0., min(recombProb, 1.));
  if (std::isnan(recombProb) || std::isnan(elecFrac) || Ni == 0 ||
      ValidityTests::nearlyEqual(recombProb, 0.0)) {
    result.photons = Nex;
    result.electrons = Ni;
    elecFrac = 1.0;
    result.recombProb = 0.;
    result.Variance = 0.;
    return result;
  }

  // set omega (non-binomial recombination fluctuations parameter) according to
  // whether the Lindhard <1, i.e. this is NR.
  double omega = yields.Lindhard < 1
                     ? RecombOmegaNR(elecFrac, NRERWidthsParam)
                     : RecombOmegaER(yields.ElectricField, elecFrac,
                                     NRERWidthsParam);
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))
    omega = 0.0;  // Ar has no non-binom sauce
  double Variance =
      recombProb * (1. - recombProb) * Ni + omega * omega * Ni * Ni;
  // if ( !fdetector->get_OldW13eV() ) Variance /= sqrt ( ZurichEXOQ );

  double skewness;
  if ((yields.PhotonYield + yields.ElectronYield) > 1e4 ||
      yields.ElectricField > 4e3 || yields.ElectricField < 50.) {
    skewness = 0.00;  // make it a constant 0 when outside the range of Vetri
                      // Velan's Run04 models.
  } else {
    // LUX Skewness Model
    Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                                 fdetector->get_OldW13eV());
    double Wq_eV = wvalue.Wq_eV;
    double engy = 1e-3 * Wq_eV * (yields.PhotonYield + yields.ElectronYield);
    double fld = yields.ElectricField;

    double alpha0 = 1.39;
    double cc0 = 4.0, cc1 = 22.1;
    double E0 = 7.7, E1 = 54., E2 = 26.7, E3 = 6.4;
    double F0 = 225., F1 = 71.;

    skewness = 0.;

    if (ValidityTests::nearlyEqual(yields.Lindhard, 1.)) {
      if (SkewnessER != -999.) {
        skewness = SkewnessER;
      } else {
        skewness = 1. / (1. + exp((engy - E2) / E3)) *
                       (alpha0 + cc0 * exp(-1. * fld / F0) *
                                     (1. - exp(-1. * engy / E0))) +
                   1. / (1. + exp(-1. * (engy - E2) / E3)) * cc1 *
                       exp(-1. * engy / E1) * exp(-1. * sqrt(fld) / sqrt(F1));
      }

      // if ( std::abs(skewness) <= DBL_MIN ) skewness = DBL_MIN;
    } else {
      skewness = NRERWidthsParam[5];  // 2.25 but ~5-20 also good (for NR). All
                                      // better than zero, but 0 is OK too
    }  // note to self: find way to make 0 for ion (wall BG) incl. alphas?
  }

  double widthCorrection =
      sqrt(1. - (2. / M_PI) * skewness * skewness / (1. + skewness * skewness));
  double muCorrection = (sqrt(Variance) / widthCorrection) *
                        (skewness / sqrt(1. + skewness * skewness)) * 2. *
                        inv_sqrt2_PI;
  if (std::abs(skewness) > DBL_MIN &&
      ValidityTests::nearlyEqual(ATOM_NUM,
                                 54.))  // skewness model only for Xenon!
    Ne = int(floor(RandomGen::rndm()->rand_skewGauss(
                       (1. - recombProb) * Ni - muCorrection,
                       sqrt(Variance) / widthCorrection, skewness) +
                   0.5));
  else {
    Ne = int(floor(RandomGen::rndm()->rand_gauss((1. - recombProb) * Ni,
                                                 sqrt(Variance), true) +
                   0.5));
  }

  Ne = NESTcalc::clamp(Ne, 0, Ni);

  Nph = Nq_actual - Ne;
  if (Nph > Nq_actual) Nph = Nq_actual;
  if (Nph < Nex) Nph = Nex;

  if ((Nph + Ne) != (Nex + Ni)) {
    throw std::runtime_error(
        "ERROR: Quanta not conserved. Tell Matthew Immediately!");
  }

  result.Variance = Variance;
  result.recombProb = recombProb;
  result.photons = Nph;
  result.electrons = Ne;

  return result;  // quanta returned with recomb fluctuations
}